

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_external_partition_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::ExternalPartitionTestDfsAPI_EncodeMatch_Test::
~ExternalPartitionTestDfsAPI_EncodeMatch_Test(ExternalPartitionTestDfsAPI_EncodeMatch_Test *this)

{
  ExternalPartitionTestDfsAPI_EncodeMatch_Test *in_stack_00000010;
  
  anon_unknown.dwarf_87c1cb::ExternalPartitionTestDfsAPI_EncodeMatch_Test::
  ~ExternalPartitionTestDfsAPI_EncodeMatch_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(ExternalPartitionTestDfsAPI, EncodeMatch) {
  ::libaom_test::Y4mVideoSource video("paris_352_288_30.y4m", 0, kFrameNum);
  SetExternalPartition(false);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  const double psnr = GetAveragePsnr();

  SetExternalPartition(true);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
  const double psnr2 = GetAveragePsnr();

  EXPECT_DOUBLE_EQ(psnr, psnr2);
}